

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O3

bool Diligent::VerifyDrawIndirectAttribs(DrawIndirectAttribs *Attribs)

{
  IBuffer *pIVar1;
  IBuffer *pIVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ulong uVar5;
  char (*Args_1) [26];
  char (*in_RCX) [49];
  char (*in_R9) [53];
  char (*pacVar6) [7];
  string msg;
  Uint64 ReqCountBufSize;
  Uint64 ReqAttrBufSize;
  char (*Args_3) [53];
  undefined4 extraout_var_00;
  
  pIVar1 = Attribs->pAttribsBuffer;
  pIVar2 = Attribs->pCounterBuffer;
  if (pIVar1 == (IBuffer *)0x0) {
    FormatString<char[36],char[49]>
              (&msg,(Diligent *)"Draw indirect attribs are invalid: ",
               (char (*) [36])"indirect draw arguments buffer must not be null.",in_RCX);
    in_RCX = (char (*) [49])0x76;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDrawIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x76);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pacVar6 = (char (*) [7])0x25e460;
  iVar3 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar1);
  Args_3 = (char (*) [53])CONCAT44(extraout_var,iVar3);
  if (((*Args_3)[0x11] & 1U) == 0) {
    FormatString<char[36],char[33],char_const*,char[53]>
              (&msg,(Diligent *)"Draw indirect attribs are invalid: ",(char (*) [36])0x35bac5,
               (char (*) [33])Args_3,
               (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
    in_RCX = (char (*) [49])0x79;
    pacVar6 = (char (*) [7])0x25e4aa;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDrawIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x79);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      pacVar6 = (char (*) [7])0x25e4c5;
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (1 < Attribs->DrawCount) {
    uVar4 = Attribs->DrawArgsStride;
    if (uVar4 < 0x10) {
      FormatString<char[36],char[37]>
                (&msg,(Diligent *)"Draw indirect attribs are invalid: ",
                 (char (*) [36])"stride must be greater than 16 bytes",(char (*) [37])in_RCX);
      in_RCX = (char (*) [49])0x7d;
      pacVar6 = (char (*) [7])0x25e50e;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDrawIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x7d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        pacVar6 = (char (*) [7])0x25e529;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      uVar4 = Attribs->DrawArgsStride;
    }
    if ((uVar4 & 3) != 0) {
      FormatString<char[36],char[31]>
                (&msg,(Diligent *)"Draw indirect attribs are invalid: ",
                 (char (*) [36])"stride must be a multiple of 4",(char (*) [31])in_RCX);
      pacVar6 = (char (*) [7])0x25e567;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDrawIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x7e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        pacVar6 = (char (*) [7])0x25e582;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  uVar5 = 0x10;
  if (1 < Attribs->DrawCount) {
    uVar5 = (ulong)(Attribs->DrawArgsStride * Attribs->DrawCount);
  }
  ReqAttrBufSize = uVar5 + Attribs->DrawArgsOffset;
  if (*(ulong *)(*Args_3 + 8) < ReqAttrBufSize) {
    FormatString<char[36],char[25],unsigned_long,char[38],char_const*,char[25],unsigned_long,char[7]>
              (&msg,(Diligent *)"Draw indirect attribs are invalid: ",
               (char (*) [36])"invalid DrawArgsOffset (",(char (*) [25])&Attribs->DrawArgsOffset,
               (unsigned_long *)") or indirect draw arguments buffer \'",(char (*) [38])Args_3,
               (char **)"\' size must be at least ",(char (*) [25])&ReqAttrBufSize,
               (unsigned_long *)0x35bbe0,pacVar6);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDrawIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x83);
    in_R9 = Args_3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      in_R9 = Args_3;
    }
  }
  if (pIVar2 != (IBuffer *)0x0) {
    pacVar6 = (char (*) [7])0x25e63b;
    iVar3 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
    Args_1 = (char (*) [26])CONCAT44(extraout_var_00,iVar3);
    if (((*Args_1)[0x11] & 1U) == 0) {
      FormatString<char[36],char[26],char_const*,char[53]>
                (&msg,(Diligent *)"Draw indirect attribs are invalid: ",
                 (char (*) [36])"indirect counter buffer \'",Args_1,
                 (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
      pacVar6 = (char (*) [7])0x25e684;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDrawIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x89);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        pacVar6 = (char (*) [7])0x25e69f;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    ReqCountBufSize = Attribs->CounterOffset + 4;
    if (*(ulong *)(*Args_1 + 8) < ReqCountBufSize) {
      FormatString<char[36],char[24],unsigned_long,char[22],char_const*,char[25],unsigned_long,char[7]>
                (&msg,(Diligent *)"Draw indirect attribs are invalid: ",
                 (char (*) [36])"invalid CounterOffset (",(char (*) [24])&Attribs->CounterOffset,
                 (unsigned_long *)") or counter buffer \'",(char (*) [22])Args_1,
                 (char **)"\' size must be at least ",(char (*) [25])&ReqCountBufSize,
                 (unsigned_long *)0x35bbe0,pacVar6);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDrawIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x8c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return true;
}

Assistant:

bool VerifyDrawIndirectAttribs(const DrawIndirectAttribs& Attribs)
{
    const IBuffer* pAttribsBuffer = Attribs.pAttribsBuffer;
    const IBuffer* pCounterBuffer = Attribs.pCounterBuffer;

#define CHECK_DRAW_INDIRECT_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw indirect attribs are invalid: ", __VA_ARGS__)

    CHECK_DRAW_INDIRECT_ATTRIBS(pAttribsBuffer != nullptr, "indirect draw arguments buffer must not be null.");
    const BufferDesc& AttrBuffDesc = pAttribsBuffer->GetDesc();
    CHECK_DRAW_INDIRECT_ATTRIBS((AttrBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0,
                                "indirect draw arguments buffer '", AttrBuffDesc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");

    if (Attribs.DrawCount > 1)
    {
        CHECK_DRAW_INDIRECT_ATTRIBS(Attribs.DrawArgsStride >= sizeof(Uint32) * 4, "stride must be greater than 16 bytes");
        CHECK_DRAW_INDIRECT_ATTRIBS(Attribs.DrawArgsStride % 4 == 0, "stride must be a multiple of 4");
    }

    const Uint64 ReqAttrBufSize = Attribs.DrawArgsOffset + (Attribs.DrawCount > 1 ? Attribs.DrawCount * Attribs.DrawArgsStride : Uint32{sizeof(Uint32)} * 4);
    CHECK_DRAW_INDIRECT_ATTRIBS(ReqAttrBufSize <= AttrBuffDesc.Size, "invalid DrawArgsOffset (", Attribs.DrawArgsOffset,
                                ") or indirect draw arguments buffer '", AttrBuffDesc.Name, "' size must be at least ", ReqAttrBufSize, " bytes");

    if (pCounterBuffer != nullptr)
    {
        const BufferDesc& CntBuffDesc = pCounterBuffer->GetDesc();
        CHECK_DRAW_INDIRECT_ATTRIBS((CntBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0, "indirect counter buffer '",
                                    CntBuffDesc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");
        const Uint64 ReqCountBufSize = Attribs.CounterOffset + sizeof(Uint32);
        CHECK_DRAW_INDIRECT_ATTRIBS(ReqCountBufSize <= CntBuffDesc.Size, "invalid CounterOffset (", Attribs.CounterOffset,
                                    ") or counter buffer '", CntBuffDesc.Name, "' size must be at least ", ReqCountBufSize, " bytes");
    }

#undef CHECK_DRAW_INDIRECT_ATTRIBS

    return true;
}